

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::NavCalcPreferredRefPos(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *g;
  ImVec2 IVar2;
  ImVec2 IVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  ImVec2 pos;
  ImRect visible_rect;
  ImVec2 local_18;
  ImVec2 local_10;
  ImVec2 IStack_8;
  
  if (((GImGui->NavDisableHighlight == false) && (GImGui->NavDisableMouseHover == true)) &&
     (pIVar1 = GImGui->NavWindow, pIVar1 != (ImGuiWindow *)0x0)) {
    auVar4._0_4_ = (GImGui->Style).FramePadding.x * 4.0;
    IVar2 = pIVar1->NavRectRel[GImGui->NavLayer].Min;
    fVar6 = IVar2.x;
    IVar3 = pIVar1->NavRectRel[GImGui->NavLayer].Max;
    fVar7 = IVar3.y;
    auVar4._4_4_ = (GImGui->Style).FramePadding.y;
    auVar4._8_8_ = 0;
    auVar5._4_4_ = fVar7 - IVar2.y;
    auVar5._0_4_ = IVar3.x - fVar6;
    auVar5._8_8_ = 0;
    auVar5 = minps(auVar4,auVar5);
    local_18.x = (pIVar1->Pos).x + fVar6 + auVar5._0_4_;
    local_18.y = (pIVar1->Pos).y + (fVar7 - auVar5._4_4_);
    IStack_8 = (GImGui->IO).DisplaySize;
    local_10.x = 0.0;
    local_10.y = 0.0;
    IVar2 = ImClamp(&local_18,&local_10,IStack_8);
    IVar3.x = (float)(int)IVar2.x;
    IVar3.y = (float)(int)IVar2.y;
    return IVar3;
  }
  if ((-256000.0 <= (GImGui->IO).MousePos.x) && (-256000.0 <= (GImGui->IO).MousePos.y)) {
    return (GImGui->IO).MousePos;
  }
  return GImGui->LastValidMousePos;
}

Assistant:

static ImVec2 ImGui::NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !g.NavWindow)
    {
        // Mouse (we need a fallback in case the mouse becomes invalid after being used)
        if (IsMousePosValid(&g.IO.MousePos))
            return g.IO.MousePos;
        return g.LastValidMousePos;
    }
    else
    {
        // When navigation is active and mouse is disabled, decide on an arbitrary position around the bottom left of the currently navigated item.
        const ImRect& rect_rel = g.NavWindow->NavRectRel[g.NavLayer];
        ImVec2 pos = g.NavWindow->Pos + ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x * 4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
        ImRect visible_rect = GetViewportRect();
        return ImFloor(ImClamp(pos, visible_rect.Min, visible_rect.Max));   // ImFloor() is important because non-integer mouse position application in backend might be lossy and result in undesirable non-zero delta.
    }
}